

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpl_model.c
# Opt level: O3

void get_rate_distortion(int *rate_cost,int64_t *recon_error,int64_t *pred_error,int16_t *src_diff,
                        tran_low_t *coeff,tran_low_t *qcoeff,tran_low_t *dqcoeff,AV1_COMMON *cm,
                        MACROBLOCK *x,YV12_BUFFER_CONFIG **ref_frame_ptr,uint8_t **rec_buffer_pool,
                        int *rec_stride_pool,TX_SIZE tx_size,PREDICTION_MODE best_mode,int mi_row,
                        int mi_col,int use_y_only_rate_distortion,int do_recon,
                        TplTxfmStats *tpl_txfm_stats)

{
  BLOCK_SIZE BVar1;
  int iVar2;
  YV12_BUFFER_CONFIG *pYVar3;
  sbyte sVar4;
  tran_low_t *ptVar5;
  undefined4 uVar6;
  byte bVar7;
  byte bVar8;
  InterpFilterParams *pIVar9;
  InterpFilterParams *pIVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  int iVar16;
  undefined8 in_R10;
  uint8_t *pred8;
  long pred_stride;
  SCAN_ORDER *sc;
  BitDepthInfo bd_info;
  uint uVar17;
  long lVar18;
  int_mv best_mv;
  uint local_210;
  uint local_20c;
  int local_208;
  int local_204;
  uint8_t *local_200;
  ulong local_1f8;
  ulong local_1f0;
  uint local_1e8;
  int local_1e4;
  tran_low_t *local_1e0;
  MACROBLOCKD *local_1d8;
  long local_1d0;
  macroblockd_plane *local_1c8;
  ulong local_1c0;
  int64_t sse;
  uint8_t *puStack_1b0;
  uint8_t *local_1a8;
  int src_stride_pool [3];
  InterPredParams local_120;
  uint8_t *local_48 [3];
  
  *rate_cost = 0;
  *recon_error = 1;
  *pred_error = 1;
  pYVar3 = (x->e_mbd).cur_buf;
  local_48[0] = (pYVar3->field_5).field_0.y_buffer;
  local_48[1] = (pYVar3->field_5).field_0.u_buffer;
  local_48[2] = (pYVar3->field_5).field_0.v_buffer;
  src_stride_pool[0] = (pYVar3->field_4).field_0.y_stride;
  local_1e8 = (uint)(best_mode == '\x18');
  src_stride_pool[1] = (pYVar3->field_4).field_0.uv_stride;
  src_stride_pool[2] = src_stride_pool[1];
  BVar1 = txsize_to_bsize[tx_size];
  local_208 = mi_row << 2;
  local_204 = mi_col << 2;
  local_1d8 = &x->e_mbd;
  local_1e4 = (int)CONCAT71((int7)((ulong)in_R10 >> 8),best_mode) + -0x19;
  uVar15 = 0;
  local_1e0 = qcoeff;
  do {
    local_1c8 = (x->e_mbd).plane + uVar15;
    iVar11 = (x->e_mbd).plane[uVar15].subsampling_x;
    iVar2 = (x->e_mbd).plane[uVar15].subsampling_y;
    local_1f8 = (ulong)av1_ss_size_lookup[BVar1][iVar11][iVar2];
    local_1d0 = (long)rec_stride_pool[uVar15];
    local_200 = rec_buffer_pool[uVar15] +
                ((local_204 >> ((byte)iVar11 & 0x1f)) +
                (rec_stride_pool[uVar15] * local_208 >> ((byte)iVar2 & 0x1f)));
    pIVar9 = av1_interp_4tap;
    pIVar10 = av1_interp_4tap;
    if ((0x10003UL >> (local_1f8 & 0x3f) & 1) == 0) {
      pIVar10 = av1_interp_filter_params_list;
    }
    if ((0x20005UL >> (local_1f8 & 0x3f) & 1) == 0) {
      pIVar9 = av1_interp_filter_params_list;
    }
    lVar14 = (ulong)(uVar15 != 0) * 4;
    uVar6 = 1;
    lVar18 = 0;
    lVar13 = local_1d0;
    local_1c0 = uVar15;
    do {
      uVar12 = local_1c0;
      pred_stride = local_1d0;
      pred8 = local_200;
      if ((byte)local_1e4 < 0xf4) {
        local_210 = (uint)CONCAT71(0x50b9,block_size_wide[local_1f8]);
        local_20c = (uint)CONCAT71(0x50b9,block_size_high[local_1f8]);
        av1_predict_intra_block
                  (local_1d8,(BLOCK_SIZE)(cm->current_frame).skip_mode_info.ref_frame_idx_0,
                   (uint)*(byte *)((long)&cm->height + 1),(uint)block_size_wide[local_1f8],
                   (uint)block_size_high[local_1f8],""[local_1f8],best_mode,0,0,'\x05',local_200,
                   (int)lVar13,local_200,(int)lVar13,0,0,(int)uVar15);
        uVar12 = uVar15;
        pred_stride = lVar13;
        break;
      }
      local_1f0 = CONCAT44(local_1f0._4_4_,uVar6);
      best_mv = (*(x->e_mbd).mi)->mv[lVar18];
      pYVar3 = ref_frame_ptr[lVar18];
      sse = (int64_t)(pYVar3->field_5).field_0.y_buffer;
      puStack_1b0 = (pYVar3->field_5).field_0.u_buffer;
      local_1a8 = (pYVar3->field_5).field_0.v_buffer;
      bVar7 = (byte)local_1c8->subsampling_y;
      bVar8 = (byte)local_1c8->subsampling_x;
      local_120.ref_frame_buf.width = *(int *)((long)pYVar3->store_buf_adr + lVar14 + -0x48);
      local_120.ref_frame_buf.height = *(int *)((long)pYVar3->store_buf_adr + lVar14 + -0x40);
      local_120.ref_frame_buf.stride = *(int *)((long)pYVar3->store_buf_adr + lVar14 + -0x28);
      local_120.bit_depth = (x->e_mbd).bd;
      local_210 = (uint)block_size_wide[local_1f8];
      local_120.block_width = local_210;
      local_20c = (uint)block_size_high[local_1f8];
      local_120.block_height = local_20c;
      local_120.pix_row = local_208 >> (bVar7 & 0x1f);
      local_120.pix_col = local_204 >> (bVar8 & 0x1f);
      local_120.subsampling_x = local_1c8->subsampling_x;
      local_120.subsampling_y = local_1c8->subsampling_y;
      local_120.use_hbd_buf = (uint)((x->e_mbd).cur_buf)->flags >> 3 & 1;
      local_120.is_intrabc = 0;
      local_120.mode = TRANSLATION_PRED;
      local_120.comp_mode = UNIFORM_SINGLE;
      local_120.top = (0x120U >> (bVar7 & 0x1f)) * -0x400 + 0x1000;
      local_120.left = (0x120U >> (bVar8 & 0x1f)) * -0x400 + 0x1000;
      local_120.interp_filter_params[0] = pIVar10;
      local_120.interp_filter_params[1] = pIVar9;
      local_120.scale_factors = (x->e_mbd).block_ref_scale_factors[0];
      local_120.ref_frame_buf.buf0 = (uint8_t *)(&sse)[local_1c0];
      local_120.ref_frame_buf.buf = (uint8_t *)0x0;
      iVar11 = 0xb;
      if (best_mode == '\x18') {
        local_120.mode = TRANSLATION_PRED;
        local_120.comp_mode = UNIFORM_COMP;
        iVar11 = 7;
      }
      local_120.conv_params.round_0 = local_120.bit_depth + -7;
      local_120.conv_params.round_1 = 0x15 - local_120.bit_depth;
      local_120.conv_params.dst = (x->e_mbd).tmp_conv_dst;
      if (best_mode == '\x18') {
        local_120.conv_params.round_1 = 7;
      }
      if (local_120.bit_depth < 0xb) {
        local_120.conv_params.round_0 = 3;
        local_120.conv_params.round_1 = iVar11;
      }
      local_120.conv_params.do_average = (int)lVar18;
      local_120.conv_params.dst_stride = 0x80;
      local_120.conv_params.plane = (int)local_1c0;
      local_120.conv_params.is_compound = local_1e8;
      local_120.conv_params.use_dist_wtd_comp_avg = 0;
      av1_enc_build_one_inter_predictor(local_200,(int)local_1d0,&best_mv.as_mv,&local_120);
      lVar18 = 1;
      uVar6 = 0;
      uVar15 = uVar12;
      pred8 = local_200;
      lVar13 = pred_stride;
    } while (((byte)local_1f0 & best_mode == '\x18') != 0);
    uVar17 = local_210 & 0xff;
    bVar7 = ""[local_1f8];
    bd_info = (BitDepthInfo)
              (CONCAT44((uint)((x->e_mbd).cur_buf)->flags >> 3,(x->e_mbd).bd) & 0x1ffffffff);
    av1_subtract_block(bd_info,local_20c & 0xff,uVar17,src_diff,(ulong)uVar17,
                       local_48[uVar12] +
                       ((local_204 >> ((byte)local_1c8->subsampling_x & 0x1f)) +
                       (src_stride_pool[uVar12] * local_208 >>
                       ((byte)local_1c8->subsampling_y & 0x1f))),(long)src_stride_pool[uVar12],pred8
                       ,pred_stride);
    av1_quick_txfm(0,bVar7,bd_info,src_diff,uVar17,coeff);
    sc = av1_scan_orders[bVar7];
    bVar8 = "\x04\x05\x05\x06\a\a\b\t\t\n\v\v\f\r\r\x0e\x06\x06\b\b\n\n"[txsize_to_bsize[bVar7]];
    local_1f0 = (ulong)bVar7;
    av1_setup_quant(bVar7,0,0,0,(QUANT_PARAM *)&local_120);
    ptVar5 = local_1e0;
    lVar13 = (long)(1 << (bVar8 & 0x1f));
    if ((((x->e_mbd).cur_buf)->flags & 8) == 0) {
      av1_quantize_fp_facade
                (coeff,lVar13,x->plane,local_1e0,dqcoeff,(uint16_t *)&best_mv.as_int,sc,
                 (QUANT_PARAM *)&local_120);
      lVar13 = (*av1_block_error)(coeff,dqcoeff,lVar13,&sse);
    }
    else {
      av1_highbd_quantize_fp_facade
                (coeff,lVar13,x->plane,local_1e0,dqcoeff,(uint16_t *)&best_mv.as_int,sc,
                 (QUANT_PARAM *)&local_120);
      lVar13 = (*av1_highbd_block_error)(coeff,dqcoeff,lVar13,&sse,(x->e_mbd).bd);
    }
    sVar4 = ((int)local_1f8 != 9) * '\x02';
    lVar13 = lVar13 >> sVar4;
    if (lVar13 < 2) {
      lVar13 = 1;
    }
    sse = sse >> sVar4;
    if (sse < 2) {
      sse = 1;
    }
    if (best_mv.as_mv.row == 0) {
      iVar11 = 0x200;
    }
    else {
      iVar11 = 1;
      uVar15 = 0;
      do {
        iVar2 = ptVar5[sc->scan[uVar15]];
        iVar16 = -iVar2;
        if (0 < iVar2) {
          iVar16 = iVar2;
        }
        uVar17 = 0x1f;
        if (iVar16 + 1U != 0) {
          for (; iVar16 + 1U >> uVar17 == 0; uVar17 = uVar17 - 1) {
          }
        }
        iVar11 = ((iVar11 - (uint)(iVar2 == 0)) - (uVar17 ^ 0x1f)) + 0x21;
        uVar15 = uVar15 + 1;
      } while ((ushort)best_mv.as_mv.row != uVar15);
      iVar11 = iVar11 * 0x200;
    }
    if (do_recon != 0) {
      av1_inverse_transform_block
                (local_1d8,dqcoeff,0,'\0',(byte)local_1f0,local_200,(int)local_1d0,
                 best_mv.as_int & 0xffff,0);
    }
    *recon_error = *recon_error + lVar13;
    *pred_error = *pred_error + sse;
    *rate_cost = *rate_cost + iVar11;
    if ((use_y_only_rate_distortion != 0) || (uVar15 = local_1c0 + 1, 1 < local_1c0)) {
      return;
    }
  } while( true );
}

Assistant:

static void get_rate_distortion(
    int *rate_cost, int64_t *recon_error, int64_t *pred_error,
    int16_t *src_diff, tran_low_t *coeff, tran_low_t *qcoeff,
    tran_low_t *dqcoeff, AV1_COMMON *cm, MACROBLOCK *x,
    const YV12_BUFFER_CONFIG *ref_frame_ptr[2], uint8_t *rec_buffer_pool[3],
    const int rec_stride_pool[3], TX_SIZE tx_size, PREDICTION_MODE best_mode,
    int mi_row, int mi_col, int use_y_only_rate_distortion, int do_recon,
    TplTxfmStats *tpl_txfm_stats) {
  const SequenceHeader *seq_params = cm->seq_params;
  *rate_cost = 0;
  *recon_error = 1;
  *pred_error = 1;

  (void)tpl_txfm_stats;

  MACROBLOCKD *xd = &x->e_mbd;
  int is_compound = (best_mode == NEW_NEWMV);
  int num_planes = use_y_only_rate_distortion ? 1 : MAX_MB_PLANE;

  uint8_t *src_buffer_pool[MAX_MB_PLANE] = {
    xd->cur_buf->y_buffer,
    xd->cur_buf->u_buffer,
    xd->cur_buf->v_buffer,
  };
  const int src_stride_pool[MAX_MB_PLANE] = {
    xd->cur_buf->y_stride,
    xd->cur_buf->uv_stride,
    xd->cur_buf->uv_stride,
  };

  const int_interpfilters kernel =
      av1_broadcast_interp_filter(EIGHTTAP_REGULAR);

  for (int plane = 0; plane < num_planes; ++plane) {
    struct macroblockd_plane *pd = &xd->plane[plane];
    BLOCK_SIZE bsize_plane =
        av1_ss_size_lookup[txsize_to_bsize[tx_size]][pd->subsampling_x]
                          [pd->subsampling_y];

    int dst_buffer_stride = rec_stride_pool[plane];
    int dst_mb_offset =
        ((mi_row * MI_SIZE * dst_buffer_stride) >> pd->subsampling_y) +
        ((mi_col * MI_SIZE) >> pd->subsampling_x);
    uint8_t *dst_buffer = rec_buffer_pool[plane] + dst_mb_offset;
    for (int ref = 0; ref < 1 + is_compound; ++ref) {
      if (!is_inter_mode(best_mode)) {
        av1_predict_intra_block(
            xd, seq_params->sb_size, seq_params->enable_intra_edge_filter,
            block_size_wide[bsize_plane], block_size_high[bsize_plane],
            max_txsize_rect_lookup[bsize_plane], best_mode, 0, 0,
            FILTER_INTRA_MODES, dst_buffer, dst_buffer_stride, dst_buffer,
            dst_buffer_stride, 0, 0, plane);
      } else {
        int_mv best_mv = xd->mi[0]->mv[ref];
        uint8_t *ref_buffer_pool[MAX_MB_PLANE] = {
          ref_frame_ptr[ref]->y_buffer,
          ref_frame_ptr[ref]->u_buffer,
          ref_frame_ptr[ref]->v_buffer,
        };
        InterPredParams inter_pred_params;
        struct buf_2d ref_buf = {
          NULL, ref_buffer_pool[plane],
          plane ? ref_frame_ptr[ref]->uv_width : ref_frame_ptr[ref]->y_width,
          plane ? ref_frame_ptr[ref]->uv_height : ref_frame_ptr[ref]->y_height,
          plane ? ref_frame_ptr[ref]->uv_stride : ref_frame_ptr[ref]->y_stride
        };
        av1_init_inter_params(&inter_pred_params, block_size_wide[bsize_plane],
                              block_size_high[bsize_plane],
                              (mi_row * MI_SIZE) >> pd->subsampling_y,
                              (mi_col * MI_SIZE) >> pd->subsampling_x,
                              pd->subsampling_x, pd->subsampling_y, xd->bd,
                              is_cur_buf_hbd(xd), 0,
                              xd->block_ref_scale_factors[0], &ref_buf, kernel);
        if (is_compound) av1_init_comp_mode(&inter_pred_params);
        inter_pred_params.conv_params = get_conv_params_no_round(
            ref, plane, xd->tmp_conv_dst, MAX_SB_SIZE, is_compound, xd->bd);

        av1_enc_build_one_inter_predictor(dst_buffer, dst_buffer_stride,
                                          &best_mv.as_mv, &inter_pred_params);
      }
    }

    int src_stride = src_stride_pool[plane];
    int src_mb_offset = ((mi_row * MI_SIZE * src_stride) >> pd->subsampling_y) +
                        ((mi_col * MI_SIZE) >> pd->subsampling_x);

    int this_rate = 1;
    int64_t this_recon_error = 1;
    int64_t sse;
    txfm_quant_rdcost(
        x, src_diff, block_size_wide[bsize_plane],
        src_buffer_pool[plane] + src_mb_offset, src_stride, dst_buffer,
        dst_buffer_stride, coeff, qcoeff, dqcoeff, block_size_wide[bsize_plane],
        block_size_high[bsize_plane], max_txsize_rect_lookup[bsize_plane],
        do_recon, &this_rate, &this_recon_error, &sse);

#if CONFIG_BITRATE_ACCURACY
    if (plane == 0 && tpl_txfm_stats) {
      // We only collect Y plane's transform coefficient
      av1_record_tpl_txfm_block(tpl_txfm_stats, coeff);
    }
#endif  // CONFIG_BITRATE_ACCURACY

    *recon_error += this_recon_error;
    *pred_error += sse;
    *rate_cost += this_rate;
  }
}